

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t main(wchar_t argc,char **argv)

{
  char cVar1;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  __mode_t __mask;
  wchar_t wVar7;
  char *pcVar8;
  size_t sVar9;
  char *__dest;
  char *pcVar10;
  size_t sVar11;
  byte *__dest_00;
  char *pcVar12;
  tm *__tp;
  long *__s;
  int iVar13;
  char **ppcVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  byte *pbVar18;
  byte *pbVar19;
  uint uVar20;
  char **ppcVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  bool bVar26;
  char *local_7a8;
  uint local_79c;
  byte *local_778;
  time_t now;
  wchar_t test_set [52];
  char tmpdir [256];
  char local_578 [64];
  sigaction sa;
  char tmpdir_timestamp [256];
  
  pcVar8 = getcwd((char *)0x0,0x1000);
  while (sVar9 = strlen(pcVar8), pcVar8[sVar9 - 1] == '\n') {
    pcVar8[sVar9 - 1] = '\0';
  }
  pcVar17 = *argv;
  sVar9 = strlen(pcVar17);
  __dest = (char *)malloc(sVar9 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,pcVar17);
    iVar13 = 0;
    iVar15 = 0;
    pcVar12 = pcVar17;
    while( true ) {
      pcVar10 = pcVar12 + 1;
      cVar1 = *pcVar12;
      pcVar12 = pcVar10;
      iVar16 = iVar13;
      if (((cVar1 != '/') && (cVar1 != '\\')) && (pcVar12 = pcVar17, iVar16 = iVar15, cVar1 == '\0')
         ) break;
      iVar13 = iVar13 + 1;
      pcVar17 = pcVar12;
      iVar15 = iVar16;
      pcVar12 = pcVar10;
    }
    __dest[iVar15] = '\0';
    if (*__dest != '/') {
      sVar9 = strlen(pcVar8);
      sVar11 = strlen(__dest);
      __dest = (char *)realloc(__dest,sVar9 + sVar11 + 2);
      if (__dest == (char *)0x0) goto LAB_00107f3d;
      sVar9 = strlen(pcVar8);
      sVar11 = strlen(__dest);
      memmove(__dest + sVar9 + 1,__dest,sVar11);
      memcpy(__dest,pcVar8,sVar9);
      __dest[sVar9] = '/';
    }
    __dest_00 = (byte *)getenv("BSDTAR");
    testprogfile = (char *)__dest_00;
    local_7a8 = getenv("TMPDIR");
    if (((local_7a8 == (char *)0x0) && (local_7a8 = getenv("TMP"), local_7a8 == (char *)0x0)) &&
       (local_7a8 = getenv("TEMP"), local_7a8 == (char *)0x0)) {
      pcVar12 = getenv("TEMPDIR");
      local_7a8 = "/tmp";
      if (pcVar12 != (char *)0x0) {
        local_7a8 = pcVar12;
      }
    }
    pcVar12 = getenv("BSDTAR_DEBUG");
    if (pcVar12 != (char *)0x0) {
      dump_on_failure = 1;
    }
    pcVar12 = getenv("_VERBOSITY_LEVEL");
    if (pcVar12 == (char *)0x0) {
      bVar26 = true;
    }
    else {
      wVar3 = atoi(pcVar12);
      bVar26 = (uint)(wVar3 + L'\xfffffffd') < 0xfffffffc;
      verbosity = L'\0';
      if (!bVar26) {
        verbosity = wVar3;
      }
    }
    wVar3 = verbosity;
    refdir = getenv("BSDTAR_TEST_FILES");
    ppcVar21 = argv + 1;
    wVar4 = until_failure;
    while ((pcVar12 = *ppcVar21, pcVar12 != (char *)0x0 && (*pcVar12 == '-'))) {
      ppcVar21 = ppcVar21 + 1;
      pbVar18 = (byte *)(pcVar12 + 1);
      while( true ) {
        bVar2 = *pbVar18;
        uVar24 = (ulong)bVar2;
        if (bVar2 == 0) break;
        pbVar18 = pbVar18 + 1;
        if ((bVar2 & 0xfd) == 0x70) {
          pbVar19 = pbVar18;
          if (*pbVar18 != 0) {
LAB_00107214:
            pbVar18 = (byte *)0x117b23;
            goto LAB_00107217;
          }
          pbVar19 = (byte *)*ppcVar21;
          if (pbVar19 != (byte *)0x0) {
            ppcVar21 = ppcVar21 + 1;
            goto LAB_00107214;
          }
          pcVar8 = "Option -%c requires argument.\n";
LAB_00107ebf:
          fprintf(_stderr,pcVar8,uVar24);
          usage(pcVar17);
LAB_00107ece:
          pcVar8 = "ERROR: Can\'t chdir to top work dir %s\n";
          goto LAB_00107ef2;
        }
        pbVar19 = (byte *)0x0;
LAB_00107217:
        switch(bVar2) {
        case 0x6b:
          keep_temp_files = 1;
          break;
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x73:
        case 0x74:
switchD_00107228_caseD_6c:
          uVar24 = (ulong)(uint)(int)(char)bVar2;
          pcVar8 = "Unrecognized option \'%c\'\n";
          goto LAB_00107ebf;
        case 0x70:
          __dest_00 = pbVar19;
          testprogfile = (char *)pbVar19;
          break;
        case 0x71:
          if (bVar26) {
            wVar3 = wVar3 + L'\xffffffff';
            verbosity = wVar3;
          }
          break;
        case 0x72:
          refdir = (char *)pbVar19;
          break;
        case 0x75:
          wVar4 = wVar4 + L'\x01';
          until_failure = wVar4;
          break;
        case 0x76:
          if (bVar26) {
            wVar3 = wVar3 + L'\x01';
            verbosity = wVar3;
          }
          break;
        default:
          if (bVar2 != 100) goto switchD_00107228_caseD_6c;
          dump_on_failure = 1;
        }
      }
    }
    if (__dest_00 != (byte *)0x0) {
      local_778 = (byte *)0x0;
LAB_0010730c:
      sVar9 = strlen((char *)__dest_00);
      pcVar12 = (char *)malloc(sVar9 + 3);
      pcVar12[0] = '\"';
      pcVar12[1] = '\0';
      strcat(pcVar12,(char *)__dest_00);
      sVar9 = strlen(pcVar12);
      (pcVar12 + sVar9)[0] = '\"';
      (pcVar12 + sVar9)[1] = '\0';
      sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
      testprog = pcVar12;
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = L'\0';
      sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
      now = time((time_t *)0x0);
      uVar24 = 0;
LAB_001073a7:
      __tp = localtime(&now);
      strftime(tmpdir_timestamp,0x100,"%Y-%m-%dT%H.%M.%S",__tp);
      sprintf(tmpdir,"%s/%s.%s-%03d",local_7a8,pcVar17,tmpdir_timestamp,uVar24);
      wVar3 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                 ,L'઴',tmpdir,L'ǭ');
      pcVar12 = refdir;
      if (wVar3 == L'\0') goto code_r0x001073fc;
      memset(&sa,0,0x200);
      if (pcVar12 != (char *)0x0) {
        __s = (long *)0x0;
        snprintf((char *)test_set,0x80,"%s",pcVar12);
        pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
        if (pcVar12 != (char *)0x0) goto LAB_00107716;
        goto LAB_0010748a;
      }
      __s = (long *)getcwd((char *)0x0,0x1000);
      while (sVar9 = strlen((char *)__s), *(char *)((long)__s + (sVar9 - 1)) == '\n') {
        *(undefined1 *)((long)__s + (sVar9 - 1)) = 0;
      }
      snprintf((char *)test_set,0x80,"%s",__s);
      pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
      if (pcVar12 == (char *)0x0) {
        sVar9 = strlen((char *)&sa);
        strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
        sVar9 = strlen((char *)&sa);
        strncat((char *)&sa,"\n",0x1ff - sVar9);
        snprintf((char *)test_set,0x80,"%s/test",__s);
        pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
        if (pcVar12 == (char *)0x0) {
          sVar9 = strlen((char *)&sa);
          strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
          sVar9 = strlen((char *)&sa);
          strncat((char *)&sa,"\n",0x1ff - sVar9);
          snprintf((char *)test_set,0x80,"%s/%s/test",__s,"bsdtar");
          pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
          if (pcVar12 == (char *)0x0) {
            sVar9 = strlen((char *)&sa);
            strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
            sVar9 = strlen((char *)&sa);
            strncat((char *)&sa,"\n",0x1ff - sVar9);
            snprintf((char *)test_set,0x80,"%s/%s/test",__s,"tar");
            pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
            if (pcVar12 == (char *)0x0) {
              sVar9 = strlen((char *)&sa);
              strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
              sVar9 = strlen((char *)&sa);
              strncat((char *)&sa,"\n",0x1ff - sVar9);
              if (*__s != 0x6a626f2f7273752f) {
LAB_001074d2:
                printf("Unable to locate known reference file %s\n","test_patterns_2.tar.uu");
                printf("  Checked following directories:\n%s\n",&sa);
                goto LAB_00107f01;
              }
              snprintf((char *)test_set,0x80,"%s",__s + 1);
              pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
              if (pcVar12 == (char *)0x0) {
                sVar9 = strlen((char *)&sa);
                strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
                sVar9 = strlen((char *)&sa);
                strncat((char *)&sa,"\n",0x1ff - sVar9);
                snprintf((char *)test_set,0x80,"%s/test",__s + 1);
                pcVar12 = slurpfile((size_t *)0x0,"%s/%s",test_set,"test_patterns_2.tar.uu");
                if (pcVar12 == (char *)0x0) {
LAB_0010748a:
                  sVar9 = strlen((char *)&sa);
                  strncat((char *)&sa,(char *)test_set,0x1ff - sVar9);
                  sVar9 = strlen((char *)&sa);
                  strncat((char *)&sa,"\n",0x1ff - sVar9);
                  goto LAB_001074d2;
                }
              }
            }
          }
        }
      }
LAB_00107716:
      free(pcVar12);
      free(__s);
      pcVar12 = strdup((char *)test_set);
      refdir = pcVar12;
      putchar(10);
      puts("If tests fail or crash, details will be in:");
      printf("   %s\n",tmpdir);
      putchar(10);
      if (verbosity < L'\0') {
        printf("Running ");
        fflush(_stdout);
      }
      else {
        printf("Reference files will be read from: %s\n",refdir);
        printf("Running tests on: %s\n",testprog);
        printf("Exercising: ");
        fflush(_stdout);
        systemf("%s --version",testprog);
        putchar(10);
      }
      local_79c = 0;
      uVar22 = 0;
LAB_0010780f:
      pcVar10 = *ppcVar21;
      ppcVar14 = ppcVar21;
      uVar20 = uVar22;
      while (uVar5 = get_test_set(test_set,0x34,pcVar10,tests), -1 < (int)uVar5) {
        uVar22 = uVar5 + uVar20;
        for (uVar24 = 0; wVar3 = failures, uVar24 != uVar5; uVar24 = uVar24 + 1) {
          wVar4 = test_set[uVar24];
          if (verbosity != L'\xffffffff') {
            if (verbosity == L'\0') {
              printf("%3d: %-50s",(ulong)(uint)wVar4,tests[wVar4].name);
              fflush(_stdout);
            }
            else {
              printf("%3d: %s\n",(ulong)(uint)wVar4,tests[wVar4].name);
            }
          }
          wVar6 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                  ,L'ं',tmpdir);
          if (wVar6 == L'\0') goto LAB_00107ece;
          sprintf(local_578,"%s.log",tests[wVar4].name);
          logfile = (FILE *)fopen(local_578,"w");
          fprintf((FILE *)logfile,"%s\n\n",tests[wVar4].name);
          snprintf((char *)&sa,0x400,"%s/%s",tmpdir,tests[wVar4].name);
          testworkdir = (char *)&sa;
          wVar6 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                     ,L'ऎ',(char *)&sa,L'ǭ');
          if ((wVar6 == L'\0') ||
             (wVar6 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                      ,L'ए',testworkdir), wVar6 == L'\0')) {
            pcVar8 = "ERROR: Can\'t chdir to work dir %s\n";
            pcVar17 = testworkdir;
            goto LAB_00107efa;
          }
          setlocale(6,"C");
          __mask = umask(0);
          umask(__mask);
          (*tests[wVar4].func)();
          testworkdir = (char *)0x0;
          umask(__mask);
          setlocale(6,"C");
          wVar7 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                  ,L'थ',tmpdir);
          wVar6 = failures;
          if (wVar7 == L'\0') {
            pcVar8 = "ERROR: Couldn\'t chdir to temp dir %s\n";
            goto LAB_00107ef2;
          }
          tests[wVar4].failures = failures - wVar3;
          if (verbosity == L'\0') {
            pcVar10 = "FAIL\n";
            if (wVar6 == wVar3) {
              pcVar10 = "ok\n";
            }
            printf(pcVar10);
          }
          else if (verbosity == L'\xffffffff') {
            pcVar10 = "E";
            if (wVar6 == wVar3) {
              pcVar10 = ".";
            }
            printf(pcVar10);
            fflush(_stdout);
          }
          uVar20 = uVar20 + 1;
          log_console = (wchar_t)(verbosity == L'\x01');
          for (uVar23 = 0; uVar23 != 10000; uVar23 = uVar23 + 1) {
            if ((1 < failed_lines[uVar23].count) && (failed_lines[uVar23].skip == 0)) {
              logprintf("%s:%d: Summary: Failed %d times\n",failed_filename,uVar23 & 0xffffffff);
            }
          }
          failed_filename = (char *)0x0;
          memset(failed_lines,0,80000);
          fclose((FILE *)logfile);
          logfile = (FILE *)0x0;
          iVar15 = tests[wVar4].failures;
          if ((iVar15 == 0) && ((keep_temp_files & 1) == 0)) {
            wVar3 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                    ,L'ल',tmpdir);
            if (wVar3 != L'\0') {
              systemf("rm -rf %s",tests[wVar4].name);
              systemf("rm %s",local_578);
            }
            iVar15 = tests[wVar4].failures;
          }
          if ((iVar15 != 0) && (local_79c = local_79c + 1, until_failure != L'\0'))
          goto LAB_00107bcc;
        }
        ppcVar14 = ppcVar14 + (*ppcVar14 != (char *)0x0);
        pcVar10 = *ppcVar14;
        uVar20 = uVar22;
        if (pcVar10 == (char *)0x0) goto code_r0x00107bba;
      }
      printf("*** INVALID Test %s\n",*ppcVar14);
      free(pcVar12);
      free(__dest);
      usage(pcVar17);
      goto LAB_00107f3d;
    }
    sVar9 = strlen(__dest);
    __dest_00 = (byte *)malloc(sVar9 + 8);
    if (__dest_00 != (byte *)0x0) {
      strcpy((char *)__dest_00,__dest);
      sVar9 = strlen((char *)__dest_00);
      (__dest_00 + sVar9)[0] = 0x2f;
      (__dest_00 + sVar9)[1] = 0;
      sVar9 = strlen((char *)__dest_00);
      pbVar18 = __dest_00 + sVar9;
      pbVar18[0] = 0x62;
      pbVar18[1] = 0x73;
      pbVar18[2] = 100;
      pbVar18[3] = 0x74;
      pbVar18 = __dest_00 + sVar9 + 3;
      pbVar18[0] = 0x74;
      pbVar18[1] = 0x61;
      pbVar18[2] = 0x72;
      pbVar18[3] = 0;
      testprogfile = (char *)__dest_00;
      local_778 = __dest_00;
      goto LAB_0010730c;
    }
  }
LAB_00107f3d:
  fwrite("ERROR: Out of memory.",0x15,1,_stderr);
LAB_00107f01:
  exit(1);
code_r0x00107bba:
  if (until_failure == L'\0') {
LAB_00107bcc:
    free(local_778);
    free(__dest);
    free(pcVar8);
    if (L'\xffffffff' < verbosity) {
      putchar(10);
      puts("Totals:");
      printf("  Tests run:         %8d\n",(ulong)uVar20);
      printf("  Tests failed:      %8d\n",(ulong)local_79c);
      printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
      printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
      printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
    }
    if (failures == L'\0') {
      if (verbosity == L'\xffffffff') {
        putchar(10);
      }
      printf("%d tests passed, no failures\n",(ulong)uVar20);
    }
    else {
      putchar(10);
      puts("Failing tests:");
      piVar25 = &tests[0].failures;
      for (uVar24 = 0; uVar24 != 0x34; uVar24 = uVar24 + 1) {
        if (*piVar25 != 0) {
          printf("  %d: %s (%d failures)\n",uVar24 & 0xffffffff,*(char **)(piVar25 + -2));
        }
        piVar25 = piVar25 + 6;
      }
      putchar(10);
      printf("Details for failing tests: %s\n",tmpdir);
      putchar(10);
    }
    free(pcVar12);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                    ,L'ଞ',"..");
    rmdir(tmpdir);
    return (uint)(local_79c != 0);
  }
  goto LAB_0010780f;
code_r0x001073fc:
  uVar22 = (int)uVar24 + 1;
  uVar24 = (ulong)uVar22;
  if (uVar22 == 1000) goto code_r0x00107408;
  goto LAB_001073a7;
code_r0x00107408:
  pcVar8 = "ERROR: Unable to create temp directory %s\n";
LAB_00107ef2:
  pcVar17 = tmpdir;
LAB_00107efa:
  fprintf(_stderr,pcVar8,pcVar17);
  goto LAB_00107f01;
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = sizeof(tests) / sizeof(tests[0]);
	int test_set[sizeof(tests) / sizeof(tests[0])];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	time_t now;
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
	char tmpdir[256], *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[256];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#ifdef PATH_MAX
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	if ((testprogdir = (char *)malloc(strlen(progname) + 1)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strcpy(testprogdir, progname);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = (char *)realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir));
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		if ((tmp2 = (char *)malloc(strlen(testprogdir) + 1 +
			strlen(PROGRAM) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strcpy(tmp2, testprogdir);
		strcat(tmp2, "/");
		strcat(tmp2, PROGRAM);
		testprogfile = tmp2;
	}

	{
		char *testprg;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg = malloc(strlen(testprogfile) + 3);
		strcpy(testprg, "\"");
		strcat(testprg, testprogfile);
		strcat(testprg, "\"");
		testprog = testprg;
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S",
		    localtime(&now));
		sprintf(tmpdir, "%s/%s.%s-%03d", tmp, progname,
		    tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir,0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv, tests);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
				return (1);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	return (tests_failed ? 1 : 0);
}